

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlChar * xmlNodeGetLang(xmlNode *cur)

{
  int iVar1;
  xmlChar *in_RAX;
  xmlChar *lang;
  xmlChar *local_28;
  
  if (cur == (xmlNode *)0x0) {
    return (xmlChar *)0x0;
  }
  local_28 = in_RAX;
  if (cur->type != XML_NAMESPACE_DECL) {
    do {
      iVar1 = xmlNodeGetAttrValue(cur,"lang",(xmlChar *)"http://www.w3.org/XML/1998/namespace",
                                  &local_28);
      if (iVar1 < 0) {
        return (xmlChar *)0x0;
      }
      if (local_28 != (xmlChar *)0x0) {
        return local_28;
      }
      cur = cur->parent;
    } while (cur != (_xmlNode *)0x0);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlNodeGetLang(const xmlNode *cur) {
    xmlChar *lang;
    int res;

    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL))
        return(NULL);

    while (cur != NULL) {
        res = xmlNodeGetAttrValue(cur, BAD_CAST "lang", XML_XML_NAMESPACE,
                                  &lang);
        if (res < 0)
            return(NULL);
	if (lang != NULL)
	    return(lang);

	cur = cur->parent;
    }

    return(NULL);
}